

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O2

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *
vkt::geometry::bindImage
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          DeviceInterface *vk,VkDevice device,Allocator *allocator,VkImage image,
          MemoryRequirement requirement)

{
  Allocation *pAVar1;
  VkResult result;
  VkMemoryRequirements VStack_48;
  
  ::vk::getImageMemoryRequirements(&VStack_48,vk,device,image);
  (*allocator->_vptr_Allocator[3])
            (__return_storage_ptr__,allocator,&VStack_48,(ulong)requirement.m_flags);
  pAVar1 = (__return_storage_ptr__->
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr;
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,image.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(device, image, alloc->getMemory(), alloc->getOffset())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/geometry/vktGeometryTestsUtil.cpp"
                    ,0x2ba);
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<Allocation> bindImage (const DeviceInterface& vk, const VkDevice device, Allocator& allocator, const VkImage image, const MemoryRequirement requirement)
{
	de::MovePtr<Allocation> alloc = allocator.allocate(getImageMemoryRequirements(vk, device, image), requirement);
	VK_CHECK(vk.bindImageMemory(device, image, alloc->getMemory(), alloc->getOffset()));
	return alloc;
}